

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O0

int exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
              (float param_1,byte param_2,score_iterator *param_3,score_iterator *param_4)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  score_iterator d_4;
  float ratio;
  float *prob_1;
  score_iterator d_3;
  float *prob;
  score_iterator d_2;
  uint16_t num_actions_touched;
  float untouched_mass;
  float touched_mass;
  score_iterator d_1;
  score_iterator d;
  size_t support_size;
  size_t num_actions;
  float local_c8;
  float local_bc;
  score_iterator local_a8;
  float local_94;
  float *local_90;
  score_iterator local_88;
  float *local_78;
  score_iterator local_70;
  ushort local_5a;
  float local_58;
  float local_54;
  score_iterator local_50;
  score_iterator local_40;
  size_t local_30;
  size_t local_28;
  score_iterator *local_20;
  score_iterator *local_18;
  byte local_d;
  float local_c;
  int local_4;
  
  local_d = param_2 & 1;
  local_20 = param_4;
  local_18 = param_3;
  local_c = param_1;
  bVar2 = ACTION_SCORE::score_iterator::operator==(param_3,param_4);
  if ((bVar2) || (bVar2 = ACTION_SCORE::score_iterator::operator<(param_4,param_3), bVar2)) {
    local_4 = 1;
  }
  else {
    local_30 = ACTION_SCORE::score_iterator::operator-(param_4,param_3);
    local_28 = local_30;
    if (local_c <= 0.999) {
      local_c8 = (float)local_30;
      local_c = local_c / local_c8;
      local_54 = 0.0;
      local_58 = 0.0;
      local_5a = 0;
      ACTION_SCORE::score_iterator::score_iterator(&local_70,param_3);
      while (bVar2 = ACTION_SCORE::score_iterator::operator!=(&local_70,param_4), bVar2) {
        local_78 = ACTION_SCORE::score_iterator::operator*(&local_70);
        if (((*local_78 <= 0.0) &&
            (((*local_78 != 0.0 || (NAN(*local_78))) || ((local_d & 1) == 0)))) ||
           (local_c < *local_78)) {
          local_58 = *local_78 + local_58;
        }
        else {
          local_54 = local_c + local_54;
          *local_78 = local_c;
          local_5a = local_5a + 1;
        }
        ACTION_SCORE::score_iterator::operator++(&local_70);
      }
      if (0.0 < local_54) {
        if (local_54 <= 0.999) {
          local_94 = (1.0 - local_54) / local_58;
          ACTION_SCORE::score_iterator::score_iterator(&local_a8,param_3);
          while (bVar2 = ACTION_SCORE::score_iterator::operator!=(&local_a8,param_4), bVar2) {
            pfVar3 = ACTION_SCORE::score_iterator::operator*(&local_a8);
            fVar1 = local_94;
            if (local_c < *pfVar3) {
              pfVar3 = ACTION_SCORE::score_iterator::operator*(&local_a8);
              *pfVar3 = fVar1 * *pfVar3;
            }
            ACTION_SCORE::score_iterator::operator++(&local_a8);
          }
        }
        else {
          local_c = (1.0 - local_58) / (float)local_5a;
          ACTION_SCORE::score_iterator::score_iterator(&local_88,param_3);
          while (bVar2 = ACTION_SCORE::score_iterator::operator!=(&local_88,param_4), bVar2) {
            local_90 = ACTION_SCORE::score_iterator::operator*(&local_88);
            if (((0.0 < *local_90) ||
                (((*local_90 == 0.0 && (!NAN(*local_90))) && ((local_d & 1) != 0)))) &&
               (*local_90 <= local_c)) {
              *local_90 = local_c;
            }
            ACTION_SCORE::score_iterator::operator++(&local_88);
          }
        }
      }
      local_4 = 0;
    }
    else {
      if ((local_d & 1) == 0) {
        ACTION_SCORE::score_iterator::score_iterator(&local_40,param_3);
        while (bVar2 = ACTION_SCORE::score_iterator::operator!=(&local_40,param_4), bVar2) {
          pfVar3 = ACTION_SCORE::score_iterator::operator*(&local_40);
          if ((*pfVar3 == 0.0) && (!NAN(*pfVar3))) {
            local_30 = local_30 - 1;
          }
          ACTION_SCORE::score_iterator::operator++(&local_40);
        }
      }
      ACTION_SCORE::score_iterator::score_iterator(&local_50,param_3);
      while (bVar2 = ACTION_SCORE::score_iterator::operator!=(&local_50,param_4), bVar2) {
        if (((local_d & 1) != 0) ||
           (pfVar3 = ACTION_SCORE::score_iterator::operator*(&local_50), 0.0 < *pfVar3)) {
          local_bc = (float)local_30;
          pfVar3 = ACTION_SCORE::score_iterator::operator*(&local_50);
          *pfVar3 = 1.0 / local_bc;
        }
        ACTION_SCORE::score_iterator::operator++(&local_50);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int enforce_minimum_probability(float minimum_uniform, bool update_zero_elements, It pdf_first, It pdf_last, std::random_access_iterator_tag /* pdf_tag */)
  {
    // iterators don't support <= in general
    if (pdf_first == pdf_last || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;

	  size_t num_actions = pdf_last - pdf_first;

    if (minimum_uniform > 0.999) // uniform exploration
    {
      size_t support_size = num_actions;
      if (!update_zero_elements)
      {
        for (It d = pdf_first; d != pdf_last; ++d)
          if (*d == 0)
            support_size--;
      }

	    for (It d = pdf_first; d != pdf_last; ++d)
        if (update_zero_elements || *d > 0)
          *d = 1.f / support_size;

      return S_EXPLORATION_OK;
    }

    minimum_uniform /= num_actions;
    float touched_mass = 0.;
    float untouched_mass = 0.;
    uint16_t num_actions_touched = 0;

	  for (It d = pdf_first; d != pdf_last; ++d)
    {
      auto& prob = *d;
      if ((prob > 0 || (prob == 0 && update_zero_elements)) && prob <= minimum_uniform)
      {
        touched_mass += minimum_uniform;
        prob = minimum_uniform;
        ++num_actions_touched;
      }
      else
        untouched_mass += prob;
    }

    if (touched_mass > 0.)
    {
      if (touched_mass > 0.999)
      {
        minimum_uniform = (1.f - untouched_mass) / (float)num_actions_touched;
        for (It d = pdf_first; d != pdf_last; ++d)
        {
          auto& prob = *d;
          if ((prob > 0 || (prob == 0 && update_zero_elements)) && prob <= minimum_uniform)
            prob = minimum_uniform;
        }
      }
      else
      {
        float ratio = (1.f - touched_mass) / untouched_mass;
        for (It d = pdf_first; d != pdf_last; ++d)
          if (*d > minimum_uniform)
            *d *= ratio;
      }
    }

    return S_EXPLORATION_OK;
  }